

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_chunk_test.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::ExtractTest_ExtractNone_Test::TestBody
          (ExtractTest_ExtractNone_Test *this)

{
  pointer *pppFVar1;
  iterator __position;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  size_type in_RCX;
  const_iterator __begin3;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var3;
  char *pcVar4;
  const_iterator __end3;
  Span<const_char_*> field_names_00;
  FieldDescriptor *field;
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  chunks;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  extracted;
  char *field_names [2];
  bool local_172;
  bool local_171;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_170;
  AssertHelper local_168;
  undefined1 local_160 [8];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_158;
  pointer local_150;
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  local_148;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_120;
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  bool local_98;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  undefined5 local_70;
  undefined3 uStack_6b;
  undefined5 uStack_68;
  bool local_63;
  undefined7 local_62;
  undefined4 uStack_5b;
  char *local_48;
  char *pcStack_40;
  
  local_48 = "optional_int32";
  pcStack_40 = "optional_int64";
  field_names_00.len_ = in_RCX;
  field_names_00.ptr_ = (pointer)0x2;
  CreateFieldArray<proto2_unittest::TestAllTypes>
            ((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_160,(anon_unknown_0 *)&local_48,field_names_00);
  _Var2._M_head_impl = local_158._M_head_impl;
  local_118._M_p = (pointer)&local_108;
  local_128 = (undefined1  [8])0x0;
  pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_110 = 0;
  local_108._M_local_buf[0] = '\0';
  local_f8._M_p = (pointer)&local_e8;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = false;
  local_90.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_90.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_90.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  local_70 = 0;
  uStack_6b = 0;
  uStack_68._0_4_ = kNoEnforcement;
  uStack_68._4_1_ = false;
  local_63 = true;
  local_62._0_1_ = false;
  local_62._1_1_ = false;
  local_62._2_1_ = false;
  local_62._3_1_ = false;
  local_62._4_1_ = false;
  local_62._5_1_ = false;
  local_62._6_1_ = false;
  uStack_5b._0_1_ = false;
  uStack_5b._1_1_ = false;
  uStack_5b._2_1_ = false;
  uStack_5b._3_1_ = false;
  local_148.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_160 != (undefined1  [8])local_158._M_head_impl) {
    _Var3._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )local_160;
    do {
      local_170._M_head_impl =
           *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
            _Var3._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl;
      local_168.data_._0_1_ =
           protobuf::internal::cpp::HasHasbit((FieldDescriptor *)local_170._M_head_impl);
      local_171 = IsRarelyPresent((FieldDescriptor *)local_170._M_head_impl,(Options *)local_128);
      local_172 = ShouldSplit((FieldDescriptor *)local_170._M_head_impl,(Options *)local_128);
      std::
      vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>
      ::emplace_back<bool,bool,bool>
                ((vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>
                  *)&local_148,(bool *)&local_168,&local_171,&local_172);
      __position._M_current =
           local_148.
           super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          local_148.
          super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)&local_148.
                       super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].fields,__position,
                   (FieldDescriptor **)&local_170);
      }
      else {
        *__position._M_current = (FieldDescriptor *)local_170._M_head_impl;
        pppFVar1 = &local_148.
                    super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
      _Var3._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )((long)_Var3._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 8);
    } while (_Var3._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl !=
             (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )_Var2._M_head_impl);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,
                    CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,
                    CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,
                    CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p,
                    CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) + 1);
  }
  if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_160 !=
      (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    operator_delete((void *)local_160,(long)local_150 - (long)local_160);
  }
  local_160 = (undefined1  [8])
              ((long)local_148.
                     super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_148.
                     super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_170._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_128,"chunks.size()","2",(unsigned_long *)local_160,(int *)&local_170)
  ;
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_160);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_chunk_test.cc"
               ,0x78,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if (local_160 != (undefined1  [8])0x0) {
      (*(code *)((*(FieldDescriptor **)local_160)->all_names_).payload_)();
    }
    if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_120,pbStack_120);
    }
  }
  else {
    if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_120,pbStack_120);
    }
    local_128 = (undefined1  [8])0x0;
    pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_118._M_p = (pointer)0x0;
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::IsEmptyMatcher>>::
    operator()(local_160,(char *)&local_170,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)"extracted");
    if (local_160[0] == '\0') {
      testing::Message::Message((Message *)&local_170);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_158._M_head_impl ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = ((_Alloc_hider *)&(local_158._M_head_impl)->field_0x0)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_chunk_test.cc"
                 ,0x7d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      if (local_170._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_170._M_head_impl + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_158._M_head_impl);
    }
    if (local_128 != (undefined1  [8])0x0) {
      operator_delete((void *)local_128,(long)local_118._M_p - (long)local_128);
    }
  }
  std::
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ::~vector(&local_148);
  return;
}

Assistant:

TEST(ExtractTest, ExtractNone) {
  const char* field_names[] = {"optional_int32", "optional_int64"};
  auto chunks = CreateAndCollectFields<TestAllTypes>(
      field_names, [](const FieldDescriptor* lhs, const FieldDescriptor* rhs) {
        return false;
      });

  ASSERT_EQ(chunks.size(), 2);
  auto extracted =
      ExtractFields(chunks.begin(), chunks.end(),
                    [](const FieldDescriptor* f) { return false; });

  EXPECT_THAT(extracted, IsEmpty());
}